

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

char * myasctime(void)

{
  tm *__tp;
  tm *lt;
  time_t clock;
  
  time((time_t *)&lt);
  __tp = localtime((time_t *)&lt);
  if (__tp == (tm *)0x0) {
    clock = (time_t)anon_var_dwarf_2f59b9;
  }
  else {
    clock = (time_t)asctime(__tp);
  }
  return (char *)clock;
}

Assistant:

const char *myasctime ()
{
	time_t clock;
	struct tm *lt;

	time (&clock);
	lt = localtime (&clock);
	if (lt != NULL)
	{
		return asctime (lt);
	}
	else
	{
		return "Pre Jan 01 00:00:00 1970\n";
	}
}